

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::VectorStructBuffer::VectorStructBuffer
          (VectorStructBuffer *this,Vector *other,SelectionVector *sel,idx_t count)

{
  pointer puVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar2;
  type args;
  pointer this_00;
  templated_unique_single_t vector;
  idx_t count_local;
  
  count_local = count;
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,STRUCT_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorStructBuffer_0278ebe0;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = StructVector::GetEntries(other);
  puVar1 = (pvVar2->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (pvVar2->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    args = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
    ;
    make_uniq<duckdb::Vector,duckdb::Vector&,duckdb::SelectionVector_const&,unsigned_long&>
              ((duckdb *)&vector,args,sel,&count_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
    ::emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                *)&this->children,
               (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&vector);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&vector);
  }
  return;
}

Assistant:

VectorStructBuffer::VectorStructBuffer(Vector &other, const SelectionVector &sel, idx_t count)
    : VectorBuffer(VectorBufferType::STRUCT_BUFFER) {
	auto &other_vector = StructVector::GetEntries(other);
	for (auto &child_vector : other_vector) {
		auto vector = make_uniq<Vector>(*child_vector, sel, count);
		children.push_back(std::move(vector));
	}
}